

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int param_7)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  undefined8 *puVar2;
  undefined1 uVar3;
  short sVar4;
  ushort uVar5;
  undefined8 uVar6;
  short sVar7;
  undefined8 __ptr;
  byte bVar8;
  byte bVar9;
  stbi_uc sVar10;
  int iVar11;
  stbi__uint32 sVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  stbi__jpeg *psVar16;
  long lVar17;
  void *pvVar18;
  code *pcVar19;
  undefined8 *puVar20;
  stbi_uc *psVar21;
  ulong uVar22;
  undefined8 *puVar23;
  short sVar24;
  int iVar25;
  ushort *puVar26;
  int id;
  uint uVar27;
  stbi__context *psVar28;
  undefined1 *puVar29;
  byte *pbVar30;
  int iVar31;
  int iVar32;
  long lVar33;
  void *__ptr_00;
  anon_struct_96_18_0d0905d3 *paVar34;
  byte *pbVar35;
  undefined4 *puVar36;
  ulong uVar37;
  int iVar38;
  ulong uVar39;
  ushort *puVar40;
  ulong uVar41;
  int iVar42;
  uint uVar43;
  short *psVar44;
  stbi_uc **ppsVar45;
  bool bVar46;
  undefined1 auVar47 [16];
  ulong local_190;
  stbi_uc *coutput [4];
  short data [64];
  
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri->channel_order = 0;
  psVar16 = (stbi__jpeg *)malloc(0x4888);
  psVar16->s = s;
  psVar16->idct_block_kernel = stbi__idct_simd;
  psVar16->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  psVar16->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  iVar11 = stbi__decode_jpeg_header(psVar16,1);
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  free(psVar16);
  if (iVar11 == 0) {
    iVar11 = stbi__check_png_header(s);
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    if (iVar11 == 0) {
      stbi__g_failure_reason = "unknown image type";
    }
    else {
      if ((uint)req_comp < 5) {
        data._0_8_ = s;
        iVar11 = stbi__parse_png_file((stbi__png *)data,0,req_comp);
        __ptr = data._24_8_;
        uVar6 = data._0_8_;
        if (iVar11 == 0) {
          pvVar18 = (void *)0x0;
          __ptr_00 = (void *)data._24_8_;
        }
        else {
          iVar11 = 8;
          if (8 < (int)data._32_4_) {
            iVar11 = data._32_4_;
          }
          ri->bits_per_channel = iVar11;
          data[0xc] = 0;
          data[0xd] = 0;
          data[0xe] = 0;
          data[0xf] = 0;
          pvVar18 = (void *)__ptr;
          if ((req_comp != 0) && (iVar11 = *(int *)(data._0_8_ + 0xc), iVar11 != req_comp)) {
            iVar15 = *(int *)data._0_8_;
            uVar43 = *(uint *)(data._0_8_ + 4);
            uVar22 = (ulong)uVar43;
            if ((int)data._32_4_ < 9) {
              uVar41 = 0;
              pvVar18 = stbi__malloc_mad3(req_comp,iVar15,uVar43,0);
              if (pvVar18 != (void *)0x0) {
                if ((int)uVar43 < 1) {
                  uVar22 = uVar41;
                }
                iVar31 = req_comp + iVar11 * 8;
                iVar38 = iVar15 + -1;
                uVar37 = 0;
                for (uVar39 = 0; uVar39 != uVar22; uVar39 = uVar39 + 1) {
                  if (iVar31 - 10U < 0x1a) {
                    lVar17 = uVar37 + __ptr;
                    iVar32 = iVar15 * (int)uVar39;
                    pbVar35 = (byte *)((ulong)(uint)(iVar32 * iVar11) + __ptr);
                    pbVar30 = (byte *)((ulong)(uint)(iVar32 * req_comp) + (long)pvVar18);
                    switch(iVar31) {
                    case 10:
                      lVar33 = 0;
                      for (iVar32 = iVar38; -1 < iVar32; iVar32 = iVar32 + -1) {
                        *(undefined1 *)((long)pvVar18 + lVar33 * 2 + uVar41) =
                             *(undefined1 *)(lVar17 + lVar33);
                        *(undefined1 *)((long)pvVar18 + lVar33 * 2 + uVar41 + 1) = 0xff;
                        lVar33 = lVar33 + 1;
                      }
                      break;
                    case 0xb:
                      pbVar30 = (byte *)((long)pvVar18 + uVar41 + 2);
                      for (iVar32 = iVar38; -1 < iVar32; iVar32 = iVar32 + -1) {
                        bVar8 = *pbVar35;
                        *pbVar30 = bVar8;
                        pbVar30[-1] = bVar8;
                        pbVar30[-2] = bVar8;
                        pbVar35 = pbVar35 + 1;
                        pbVar30 = pbVar30 + 3;
                      }
                      break;
                    case 0xc:
                      lVar33 = 0;
                      for (iVar32 = iVar38; -1 < iVar32; iVar32 = iVar32 + -1) {
                        uVar3 = *(undefined1 *)(lVar17 + lVar33);
                        *(undefined1 *)((long)pvVar18 + lVar33 * 4 + uVar41 + 2) = uVar3;
                        *(undefined1 *)((long)pvVar18 + lVar33 * 4 + uVar41 + 1) = uVar3;
                        *(undefined1 *)((long)pvVar18 + lVar33 * 4 + uVar41) = uVar3;
                        *(undefined1 *)((long)pvVar18 + lVar33 * 4 + uVar41 + 3) = 0xff;
                        lVar33 = lVar33 + 1;
                      }
                      break;
                    case 0x11:
                      lVar33 = 0;
                      for (iVar32 = iVar38; -1 < iVar32; iVar32 = iVar32 + -1) {
                        *(undefined1 *)((long)pvVar18 + lVar33 + uVar41) =
                             *(undefined1 *)(lVar17 + lVar33 * 2);
                        lVar33 = lVar33 + 1;
                      }
                      break;
                    case 0x13:
                      pbVar30 = (byte *)((long)pvVar18 + uVar41 + 2);
                      for (iVar32 = iVar38; -1 < iVar32; iVar32 = iVar32 + -1) {
                        bVar8 = *pbVar35;
                        *pbVar30 = bVar8;
                        pbVar30[-1] = bVar8;
                        pbVar30[-2] = bVar8;
                        pbVar35 = pbVar35 + 2;
                        pbVar30 = pbVar30 + 3;
                      }
                      break;
                    case 0x14:
                      lVar33 = 0;
                      for (iVar32 = iVar38; -1 < iVar32; iVar32 = iVar32 + -1) {
                        uVar3 = *(undefined1 *)(lVar17 + lVar33);
                        *(undefined1 *)((long)pvVar18 + lVar33 * 2 + uVar41 + 2) = uVar3;
                        *(undefined1 *)((long)pvVar18 + lVar33 * 2 + uVar41 + 1) = uVar3;
                        *(undefined1 *)((long)pvVar18 + lVar33 * 2 + uVar41) = uVar3;
                        *(undefined1 *)((long)pvVar18 + lVar33 * 2 + uVar41 + 3) =
                             *(undefined1 *)(lVar17 + 1 + lVar33);
                        lVar33 = lVar33 + 2;
                      }
                      break;
                    case 0x19:
                      for (iVar32 = iVar38; -1 < iVar32; iVar32 = iVar32 + -1) {
                        *pbVar30 = (byte)((uint)pbVar35[2] * 0x1d +
                                          (uint)pbVar35[1] * 0x96 + (uint)*pbVar35 * 0x4d >> 8);
                        pbVar35 = pbVar35 + 3;
                        pbVar30 = pbVar30 + 1;
                      }
                      break;
                    case 0x1a:
                      for (iVar32 = iVar38; -1 < iVar32; iVar32 = iVar32 + -1) {
                        *pbVar30 = (byte)((uint)pbVar35[2] * 0x1d +
                                          (uint)pbVar35[1] * 0x96 + (uint)*pbVar35 * 0x4d >> 8);
                        pbVar30[1] = 0xff;
                        pbVar35 = pbVar35 + 3;
                        pbVar30 = pbVar30 + 2;
                      }
                      break;
                    case 0x1c:
                      for (iVar32 = iVar38; -1 < iVar32; iVar32 = iVar32 + -1) {
                        *pbVar30 = *pbVar35;
                        pbVar30[1] = pbVar35[1];
                        pbVar30[2] = pbVar35[2];
                        pbVar30[3] = 0xff;
                        pbVar35 = pbVar35 + 3;
                        pbVar30 = pbVar30 + 4;
                      }
                      break;
                    case 0x21:
                      lVar33 = 0;
                      for (iVar32 = iVar38; -1 < iVar32; iVar32 = iVar32 + -1) {
                        *(char *)((long)pvVar18 + lVar33 + uVar41) =
                             (char)((uint)*(byte *)(lVar17 + 2 + lVar33 * 4) * 0x1d +
                                    (uint)*(byte *)(lVar17 + 1 + lVar33 * 4) * 0x96 +
                                    (uint)*(byte *)(lVar17 + lVar33 * 4) * 0x4d >> 8);
                        lVar33 = lVar33 + 1;
                      }
                      break;
                    case 0x22:
                      lVar33 = 0;
                      for (iVar32 = iVar38; -1 < iVar32; iVar32 = iVar32 + -1) {
                        *(char *)((long)pvVar18 + lVar33 + uVar41) =
                             (char)((uint)*(byte *)(lVar17 + 2 + lVar33 * 2) * 0x1d +
                                    (uint)*(byte *)(lVar17 + 1 + lVar33 * 2) * 0x96 +
                                    (uint)*(byte *)(lVar17 + lVar33 * 2) * 0x4d >> 8);
                        *(undefined1 *)((long)pvVar18 + lVar33 + uVar41 + 1) =
                             *(undefined1 *)(lVar17 + 3 + lVar33 * 2);
                        lVar33 = lVar33 + 2;
                      }
                      break;
                    case 0x23:
                      for (iVar32 = iVar38; -1 < iVar32; iVar32 = iVar32 + -1) {
                        *pbVar30 = *pbVar35;
                        pbVar30[1] = pbVar35[1];
                        pbVar30[2] = pbVar35[2];
                        pbVar35 = pbVar35 + 4;
                        pbVar30 = pbVar30 + 3;
                      }
                    }
                  }
                  uVar37 = (ulong)(uint)((int)uVar37 + iVar11 * iVar15);
                  uVar41 = (ulong)(uint)((int)uVar41 + iVar15 * req_comp);
                }
LAB_001036c8:
                free((void *)__ptr);
                *(int *)(uVar6 + 0xc) = req_comp;
                goto LAB_001036e0;
              }
            }
            else {
              pvVar18 = malloc((ulong)(req_comp * iVar15 * uVar43 * 2));
              if (pvVar18 != (void *)0x0) {
                iVar38 = req_comp + iVar11 * 8;
                uVar27 = 0;
                if ((int)uVar43 < 1) {
                  uVar22 = 0;
                }
                iVar31 = iVar15 + -1;
                uVar41 = 0;
                for (uVar37 = 0; uVar37 != uVar22; uVar37 = uVar37 + 1) {
                  if (iVar38 - 10U < 0x1a) {
                    lVar17 = __ptr + uVar41 * 2;
                    uVar39 = (ulong)uVar27;
                    iVar32 = iVar15 * (int)uVar37;
                    puVar40 = (ushort *)(__ptr + (ulong)(uint)(iVar32 * iVar11) * 2);
                    puVar36 = (undefined4 *)((ulong)(uint)(iVar32 * req_comp) * 2 + (long)pvVar18);
                    switch(iVar38) {
                    case 10:
                      lVar33 = 0;
                      for (iVar32 = iVar31; -1 < iVar32; iVar32 = iVar32 + -1) {
                        *(undefined2 *)((long)pvVar18 + lVar33 * 2 + uVar39 * 2) =
                             *(undefined2 *)(lVar17 + lVar33);
                        *(undefined2 *)((long)pvVar18 + lVar33 * 2 + uVar39 * 2 + 2) = 0xffff;
                        lVar33 = lVar33 + 2;
                      }
                      break;
                    case 0xb:
                      puVar26 = (ushort *)((long)pvVar18 + uVar39 * 2 + 4);
                      for (iVar32 = iVar31; -1 < iVar32; iVar32 = iVar32 + -1) {
                        uVar5 = *puVar40;
                        *puVar26 = uVar5;
                        puVar26[-1] = uVar5;
                        puVar26[-2] = uVar5;
                        puVar40 = puVar40 + 1;
                        puVar26 = puVar26 + 3;
                      }
                      break;
                    case 0xc:
                      lVar33 = 0;
                      for (iVar32 = iVar31; -1 < iVar32; iVar32 = iVar32 + -1) {
                        auVar47._8_8_ = 0;
                        auVar47._0_8_ = (ulong)*(ushort *)(lVar17 + lVar33) | 0xffff0000;
                        auVar47 = pshuflw(auVar47,auVar47,0x40);
                        *(long *)((long)pvVar18 + lVar33 * 4 + uVar39 * 2) = auVar47._0_8_;
                        lVar33 = lVar33 + 2;
                      }
                      break;
                    case 0x11:
                      lVar33 = 0;
                      for (iVar32 = iVar31; -1 < iVar32; iVar32 = iVar32 + -1) {
                        *(undefined2 *)((long)pvVar18 + lVar33 + uVar39 * 2) =
                             *(undefined2 *)(lVar17 + lVar33 * 2);
                        lVar33 = lVar33 + 2;
                      }
                      break;
                    case 0x13:
                      puVar26 = (ushort *)((long)pvVar18 + uVar39 * 2 + 4);
                      for (iVar32 = iVar31; -1 < iVar32; iVar32 = iVar32 + -1) {
                        uVar5 = *puVar40;
                        *puVar26 = uVar5;
                        puVar26[-1] = uVar5;
                        puVar26[-2] = uVar5;
                        puVar40 = puVar40 + 2;
                        puVar26 = puVar26 + 3;
                      }
                      break;
                    case 0x14:
                      lVar33 = 0;
                      for (iVar32 = iVar31; -1 < iVar32; iVar32 = iVar32 + -1) {
                        auVar47 = pshuflw(ZEXT416(*(uint *)(lVar17 + lVar33)),
                                          ZEXT416(*(uint *)(lVar17 + lVar33)),0x40);
                        *(long *)((long)pvVar18 + lVar33 * 2 + uVar39 * 2) = auVar47._0_8_;
                        lVar33 = lVar33 + 4;
                      }
                      break;
                    case 0x19:
                      for (iVar32 = iVar31; -1 < iVar32; iVar32 = iVar32 + -1) {
                        *(short *)puVar36 =
                             (short)((uint)puVar40[2] * 0x1d +
                                     (uint)puVar40[1] * 0x96 + (uint)*puVar40 * 0x4d >> 8);
                        puVar40 = puVar40 + 3;
                        puVar36 = (undefined4 *)((long)puVar36 + 2);
                      }
                      break;
                    case 0x1a:
                      for (iVar32 = iVar31; -1 < iVar32; iVar32 = iVar32 + -1) {
                        *(short *)puVar36 =
                             (short)((uint)puVar40[2] * 0x1d +
                                     (uint)puVar40[1] * 0x96 + (uint)*puVar40 * 0x4d >> 8);
                        *(undefined2 *)((long)puVar36 + 2) = 0xffff;
                        puVar40 = puVar40 + 3;
                        puVar36 = puVar36 + 1;
                      }
                      break;
                    case 0x1c:
                      for (iVar32 = iVar31; -1 < iVar32; iVar32 = iVar32 + -1) {
                        *puVar36 = *(undefined4 *)puVar40;
                        *(ushort *)(puVar36 + 1) = puVar40[2];
                        *(undefined2 *)((long)puVar36 + 6) = 0xffff;
                        puVar40 = puVar40 + 3;
                        puVar36 = puVar36 + 2;
                      }
                      break;
                    case 0x21:
                      lVar33 = 0;
                      for (iVar32 = iVar31; -1 < iVar32; iVar32 = iVar32 + -1) {
                        *(short *)((long)pvVar18 + lVar33 + uVar39 * 2) =
                             (short)((uint)*(ushort *)(lVar17 + 4 + lVar33 * 4) * 0x1d +
                                     (uint)*(ushort *)(lVar17 + 2 + lVar33 * 4) * 0x96 +
                                     (uint)*(ushort *)(lVar17 + lVar33 * 4) * 0x4d >> 8);
                        lVar33 = lVar33 + 2;
                      }
                      break;
                    case 0x22:
                      lVar33 = 0;
                      for (iVar32 = iVar31; -1 < iVar32; iVar32 = iVar32 + -1) {
                        *(short *)((long)pvVar18 + lVar33 + uVar39 * 2) =
                             (short)((uint)*(ushort *)(lVar17 + 4 + lVar33 * 2) * 0x1d +
                                     (uint)*(ushort *)(lVar17 + 2 + lVar33 * 2) * 0x96 +
                                     (uint)*(ushort *)(lVar17 + lVar33 * 2) * 0x4d >> 8);
                        *(undefined2 *)((long)pvVar18 + lVar33 + uVar39 * 2 + 2) =
                             *(undefined2 *)(lVar17 + 6 + lVar33 * 2);
                        lVar33 = lVar33 + 4;
                      }
                      break;
                    case 0x23:
                      for (iVar32 = iVar31; -1 < iVar32; iVar32 = iVar32 + -1) {
                        *puVar36 = *(undefined4 *)puVar40;
                        *(ushort *)(puVar36 + 1) = puVar40[2];
                        puVar40 = puVar40 + 4;
                        puVar36 = (undefined4 *)((long)puVar36 + 6);
                      }
                    }
                  }
                  uVar41 = (ulong)(uint)((int)uVar41 + iVar11 * iVar15);
                  uVar27 = uVar27 + req_comp * iVar15;
                }
                goto LAB_001036c8;
              }
            }
            free((void *)__ptr);
            stbi__g_failure_reason = "outofmem";
            *(int *)(uVar6 + 0xc) = req_comp;
            goto LAB_00102f97;
          }
LAB_001036e0:
          *x = *(int *)uVar6;
          *y = *(int *)(uVar6 + 4);
          if (comp != (int *)0x0) {
            *comp = *(int *)(uVar6 + 8);
          }
          __ptr_00 = (void *)0x0;
        }
        free(__ptr_00);
        free((void *)data._16_8_);
        psVar16 = (stbi__jpeg *)data._8_8_;
        goto LAB_0010389e;
      }
      stbi__g_failure_reason = "bad req_comp";
    }
LAB_00102f97:
    pvVar18 = (void *)0x0;
  }
  else {
    psVar16 = (stbi__jpeg *)malloc(0x4888);
    psVar16->s = s;
    psVar16->idct_block_kernel = stbi__idct_simd;
    psVar16->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    psVar16->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      for (lVar17 = 0x46d8; lVar17 != 0x4858; lVar17 = lVar17 + 0x60) {
        psVar21 = psVar16->huff_dc[0].fast + lVar17 + -8;
        psVar21[0] = '\0';
        psVar21[1] = '\0';
        psVar21[2] = '\0';
        psVar21[3] = '\0';
        psVar21[4] = '\0';
        psVar21[5] = '\0';
        psVar21[6] = '\0';
        psVar21[7] = '\0';
        psVar21[8] = '\0';
        psVar21[9] = '\0';
        psVar21[10] = '\0';
        psVar21[0xb] = '\0';
        psVar21[0xc] = '\0';
        psVar21[0xd] = '\0';
        psVar21[0xe] = '\0';
        psVar21[0xf] = '\0';
      }
      psVar16->restart_interval = 0;
      iVar11 = stbi__decode_jpeg_header(psVar16,0);
      if (iVar11 != 0) {
        paVar1 = psVar16->img_comp;
        bVar8 = stbi__get_marker(psVar16);
LAB_0010249d:
        if (bVar8 != 0xda) {
          if (bVar8 == 0xdc) {
            iVar11 = stbi__get16be(psVar16->s);
            sVar12 = stbi__get16be(psVar16->s);
            if (iVar11 == 4) {
              if (sVar12 == psVar16->s->img_y) goto LAB_00102500;
              stbi__g_failure_reason = "bad DNL height";
            }
            else {
              stbi__g_failure_reason = "bad DNL len";
            }
          }
          else {
            if (bVar8 == 0xd9) {
              if (psVar16->progressive == 0) {
                psVar28 = psVar16->s;
                uVar43 = psVar28->img_n;
              }
              else {
                lVar17 = 0;
                while( true ) {
                  psVar28 = psVar16->s;
                  uVar43 = psVar28->img_n;
                  if ((int)uVar43 <= lVar17) break;
                  uVar43 = psVar16->img_comp[lVar17].x + 7 >> 3;
                  iVar11 = psVar16->img_comp[lVar17].y + 7 >> 3;
                  uVar41 = 0;
                  uVar22 = (ulong)uVar43;
                  if ((int)uVar43 < 1) {
                    uVar22 = uVar41;
                  }
                  if (iVar11 < 1) {
                    iVar11 = 0;
                  }
                  while (iVar15 = (int)uVar41, iVar15 != iVar11) {
                    for (uVar41 = 0; uVar41 != uVar22; uVar41 = uVar41 + 1) {
                      psVar44 = paVar1[lVar17].coeff;
                      iVar31 = paVar1[lVar17].coeff_w * iVar15;
                      iVar38 = paVar1[lVar17].tq;
                      iVar32 = iVar31 + (int)uVar41;
                      for (lVar33 = 0; lVar33 != 0x40; lVar33 = lVar33 + 1) {
                        psVar44[iVar32 * 0x40 + lVar33] =
                             psVar44[iVar32 * 0x40 + lVar33] * psVar16->dequant[iVar38][lVar33];
                      }
                      (*psVar16->idct_block_kernel)
                                (paVar1[lVar17].data +
                                 uVar41 * 8 + (long)(iVar15 * 8 * paVar1[lVar17].w2),
                                 paVar1[lVar17].w2,psVar44 + (iVar31 + (int)uVar41) * 0x40);
                    }
                    uVar41 = (ulong)(iVar15 + 1);
                  }
                  lVar17 = lVar17 + 1;
                }
              }
              uVar27 = (2 < (int)uVar43) + 1 + (uint)(2 < (int)uVar43);
              if (req_comp != 0) {
                uVar27 = req_comp;
              }
              lVar17 = 0;
              bVar46 = false;
              if ((uVar43 == 3) && (bVar46 = true, psVar16->rgb != 3)) {
                if (psVar16->app14_color_transform == 0) {
                  bVar46 = psVar16->jfif == 0;
                }
                else {
                  bVar46 = false;
                }
              }
              uVar22 = 0;
              if (0 < (int)uVar43) {
                uVar22 = (ulong)uVar43;
              }
              uVar41 = 1;
              if (bVar46) {
                uVar41 = uVar22;
              }
              local_190 = (ulong)uVar27;
              if (2 < (int)uVar27) {
                uVar41 = uVar22;
              }
              if (uVar43 != 3) {
                uVar41 = uVar22;
              }
              for (; uVar41 * 0x30 != lVar17; lVar17 = lVar17 + 0x30) {
                sVar12 = psVar28->img_x;
                pvVar18 = malloc((ulong)(sVar12 + 3));
                *(void **)((long)&psVar16->img_comp[0].linebuf + lVar17 * 2) = pvVar18;
                if (pvVar18 == (void *)0x0) {
                  stbi__cleanup_jpeg(psVar16);
LAB_001040cf:
                  stbi__g_failure_reason = "outofmem";
                  goto LAB_0010389c;
                }
                uVar22 = (long)psVar16->img_h_max /
                         (long)*(int *)((long)&psVar16->img_comp[0].h + lVar17 * 2);
                iVar11 = (int)uVar22;
                *(int *)((long)data + lVar17 + 0x18) = iVar11;
                iVar15 = psVar16->img_v_max / *(int *)((long)&psVar16->img_comp[0].v + lVar17 * 2);
                *(int *)((long)data + lVar17 + 0x1c) = iVar15;
                *(int *)((long)data + lVar17 + 0x24) = iVar15 >> 1;
                *(int *)((long)data + lVar17 + 0x20) =
                     (int)((ulong)((sVar12 + iVar11) - 1) / (uVar22 & 0xffffffff));
                *(undefined4 *)((long)data + lVar17 + 0x28) = 0;
                uVar6 = *(undefined8 *)((long)&psVar16->img_comp[0].data + lVar17 * 2);
                *(undefined8 *)((long)data + lVar17 + 0x10) = uVar6;
                *(undefined8 *)((long)data + lVar17 + 8) = uVar6;
                if (iVar11 == 2) {
                  pcVar19 = stbi__resample_row_h_2;
                  if (iVar15 != 1) {
                    if (iVar15 != 2) goto LAB_00103a1f;
                    pcVar19 = psVar16->resample_row_hv_2_kernel;
                  }
                }
                else if (iVar11 == 1) {
                  pcVar19 = stbi__resample_row_generic;
                  if (iVar15 == 2) {
                    pcVar19 = stbi__resample_row_v_2;
                  }
                  if (iVar15 == 1) {
                    pcVar19 = resample_row_1;
                  }
                }
                else {
LAB_00103a1f:
                  pcVar19 = stbi__resample_row_generic;
                }
                *(code **)((long)data + lVar17) = pcVar19;
              }
              sVar12 = psVar28->img_y;
              pvVar18 = stbi__malloc_mad3(uVar27,psVar28->img_x,sVar12,1);
              if (pvVar18 == (void *)0x0) {
                stbi__cleanup_jpeg(psVar16);
                goto LAB_001040cf;
              }
              iVar11 = 0;
              for (uVar43 = 0; uVar43 < sVar12; uVar43 = uVar43 + 1) {
                sVar12 = psVar28->img_x;
                ppsVar45 = coutput;
                for (lVar17 = 0; uVar41 * 0x30 != lVar17; lVar17 = lVar17 + 0x30) {
                  puVar20 = (undefined8 *)((long)data + lVar17 + 0x10);
                  iVar15 = *(int *)((long)data + lVar17 + 0x24);
                  iVar38 = *(int *)((long)data + lVar17 + 0x1c);
                  iVar31 = iVar38 >> 1;
                  puVar2 = (undefined8 *)((long)data + lVar17 + 8);
                  puVar23 = puVar20;
                  if (iVar15 < iVar31) {
                    puVar23 = puVar2;
                  }
                  if (iVar31 <= iVar15) {
                    puVar20 = puVar2;
                  }
                  psVar21 = (stbi_uc *)
                            (**(code **)((long)data + lVar17))
                                      (*(undefined8 *)
                                        ((long)&psVar16->img_comp[0].linebuf + lVar17 * 2),*puVar23,
                                       *puVar20,*(undefined4 *)((long)data + lVar17 + 0x20));
                  *ppsVar45 = psVar21;
                  *(int *)((long)data + lVar17 + 0x24) = iVar15 + 1;
                  if (iVar38 <= iVar15 + 1) {
                    *(undefined4 *)((long)data + lVar17 + 0x24) = 0;
                    lVar33 = *(long *)((long)data + lVar17 + 0x10);
                    *(long *)((long)data + lVar17 + 8) = lVar33;
                    iVar15 = *(int *)((long)data + lVar17 + 0x28) + 1;
                    *(int *)((long)data + lVar17 + 0x28) = iVar15;
                    if (iVar15 < *(int *)((long)&psVar16->img_comp[0].y + lVar17 * 2)) {
                      *(long *)((long)data + lVar17 + 0x10) =
                           lVar33 + *(int *)((long)&psVar16->img_comp[0].w2 + lVar17 * 2);
                    }
                  }
                  ppsVar45 = ppsVar45 + 1;
                }
                if ((int)uVar27 < 3) {
                  psVar28 = psVar16->s;
                  if (bVar46) {
                    if (uVar27 == 1) {
                      for (uVar22 = 0; uVar22 < psVar28->img_x; uVar22 = uVar22 + 1) {
                        *(char *)((long)pvVar18 + uVar22 + sVar12 * iVar11) =
                             (char)((uint)coutput[2][uVar22] * 0x1d +
                                    (uint)coutput[1][uVar22] * 0x96 +
                                    (uint)coutput[0][uVar22] * 0x4d >> 8);
                      }
                    }
                    else {
                      for (uVar22 = 0; uVar22 < psVar28->img_x; uVar22 = uVar22 + 1) {
                        *(char *)((long)pvVar18 + uVar22 * 2 + (ulong)(sVar12 * iVar11)) =
                             (char)((uint)coutput[2][uVar22] * 0x1d +
                                    (uint)coutput[1][uVar22] * 0x96 +
                                    (uint)coutput[0][uVar22] * 0x4d >> 8);
                        *(undefined1 *)((long)pvVar18 + uVar22 * 2 + (ulong)(sVar12 * iVar11) + 1) =
                             0xff;
                      }
                    }
                  }
                  else if (psVar28->img_n == 4) {
                    if (psVar16->app14_color_transform == 2) {
                      puVar29 = (undefined1 *)((long)pvVar18 + (ulong)(sVar12 * iVar11) + 1);
                      for (uVar22 = 0; uVar22 < psVar28->img_x; uVar22 = uVar22 + 1) {
                        iVar15 = (coutput[0][uVar22] ^ 0xff) * (uint)coutput[3][uVar22];
                        puVar29[-1] = (char)((iVar15 + 0x80U >> 8) + iVar15 + 0x80 >> 8);
                        *puVar29 = 0xff;
                        puVar29 = puVar29 + local_190;
                      }
                    }
                    else {
                      if (psVar16->app14_color_transform != 0) goto LAB_00103ec3;
                      puVar29 = (undefined1 *)((long)pvVar18 + (ulong)(sVar12 * iVar11) + 1);
                      for (uVar22 = 0; uVar22 < psVar28->img_x; uVar22 = uVar22 + 1) {
                        bVar8 = coutput[3][uVar22];
                        iVar15 = (uint)coutput[0][uVar22] * (uint)bVar8;
                        iVar38 = (uint)coutput[1][uVar22] * (uint)bVar8;
                        puVar29[-1] = (char)((((uint)coutput[2][uVar22] * (uint)bVar8 + 0x80 >> 8) +
                                              (uint)coutput[2][uVar22] * (uint)bVar8 + 0x80 >> 8) *
                                             0x1d + (iVar38 + (iVar38 + 0x80U >> 8) + 0x80 >> 8) *
                                                    0x96 + (iVar15 + (iVar15 + 0x80U >> 8) + 0x80 >>
                                                           8) * 0x4d >> 8);
                        *puVar29 = 0xff;
                        puVar29 = puVar29 + local_190;
                      }
                    }
                  }
                  else {
LAB_00103ec3:
                    if (uVar27 == 1) {
                      for (uVar22 = 0; uVar22 < psVar28->img_x; uVar22 = uVar22 + 1) {
                        *(stbi_uc *)((long)pvVar18 + uVar22 + sVar12 * iVar11) = coutput[0][uVar22];
                      }
                    }
                    else {
                      for (uVar22 = 0; uVar22 < psVar28->img_x; uVar22 = uVar22 + 1) {
                        *(stbi_uc *)((long)pvVar18 + uVar22 * 2 + (ulong)(sVar12 * iVar11)) =
                             coutput[0][uVar22];
                        *(undefined1 *)((long)pvVar18 + uVar22 * 2 + (ulong)(sVar12 * iVar11) + 1) =
                             0xff;
                      }
                    }
                  }
                }
                else {
                  psVar21 = (stbi_uc *)((ulong)(uVar43 * uVar27 * sVar12) + (long)pvVar18);
                  psVar28 = psVar16->s;
                  if (psVar28->img_n == 3) {
                    if (bVar46) {
                      puVar29 = (undefined1 *)((long)pvVar18 + (ulong)(sVar12 * iVar11) + 3);
                      for (uVar22 = 0; uVar22 < psVar28->img_x; uVar22 = uVar22 + 1) {
                        puVar29[-3] = coutput[0][uVar22];
                        puVar29[-2] = coutput[1][uVar22];
                        puVar29[-1] = coutput[2][uVar22];
                        *puVar29 = 0xff;
                        puVar29 = puVar29 + local_190;
                      }
                    }
                    else {
LAB_00103efb:
                      (*psVar16->YCbCr_to_RGB_kernel)
                                (psVar21,coutput[0],coutput[1],coutput[2],psVar28->img_x,uVar27);
                    }
                  }
                  else if (psVar28->img_n == 4) {
                    if (psVar16->app14_color_transform == 2) {
                      (*psVar16->YCbCr_to_RGB_kernel)
                                (psVar21,coutput[0],coutput[1],coutput[2],psVar28->img_x,uVar27);
                      psVar28 = psVar16->s;
                      pbVar30 = (byte *)((long)pvVar18 + (ulong)(sVar12 * iVar11) + 2);
                      for (uVar22 = 0; uVar22 < psVar28->img_x; uVar22 = uVar22 + 1) {
                        bVar8 = coutput[3][uVar22];
                        iVar15 = (pbVar30[-2] ^ 0xff) * (uint)bVar8;
                        pbVar30[-2] = (byte)((iVar15 + 0x80U >> 8) + iVar15 + 0x80 >> 8);
                        iVar15 = (pbVar30[-1] ^ 0xff) * (uint)bVar8;
                        pbVar30[-1] = (byte)((iVar15 + 0x80U >> 8) + iVar15 + 0x80 >> 8);
                        iVar15 = (*pbVar30 ^ 0xff) * (uint)bVar8;
                        *pbVar30 = (byte)((iVar15 + 0x80U >> 8) + iVar15 + 0x80 >> 8);
                        pbVar30 = pbVar30 + local_190;
                      }
                    }
                    else {
                      if (psVar16->app14_color_transform != 0) goto LAB_00103efb;
                      puVar29 = (undefined1 *)((long)pvVar18 + (ulong)(sVar12 * iVar11) + 3);
                      for (uVar22 = 0; uVar22 < psVar28->img_x; uVar22 = uVar22 + 1) {
                        bVar8 = coutput[3][uVar22];
                        iVar15 = (uint)coutput[0][uVar22] * (uint)bVar8;
                        puVar29[-3] = (char)((iVar15 + 0x80U >> 8) + iVar15 + 0x80 >> 8);
                        iVar15 = (uint)coutput[1][uVar22] * (uint)bVar8;
                        puVar29[-2] = (char)((iVar15 + 0x80U >> 8) + iVar15 + 0x80 >> 8);
                        puVar29[-1] = (char)(((uint)coutput[2][uVar22] * (uint)bVar8 + 0x80 >> 8) +
                                             (uint)coutput[2][uVar22] * (uint)bVar8 + 0x80 >> 8);
                        *puVar29 = 0xff;
                        puVar29 = puVar29 + local_190;
                      }
                    }
                  }
                  else {
                    puVar29 = (undefined1 *)((long)pvVar18 + (ulong)(sVar12 * iVar11) + 3);
                    for (uVar22 = 0; uVar22 < psVar28->img_x; uVar22 = uVar22 + 1) {
                      sVar10 = coutput[0][uVar22];
                      puVar29[-1] = sVar10;
                      puVar29[-2] = sVar10;
                      puVar29[-3] = sVar10;
                      *puVar29 = 0xff;
                      puVar29 = puVar29 + local_190;
                    }
                  }
                }
                psVar28 = psVar16->s;
                sVar12 = psVar28->img_y;
                iVar11 = iVar11 + uVar27;
              }
              stbi__cleanup_jpeg(psVar16);
              psVar28 = psVar16->s;
              *x = psVar28->img_x;
              *y = psVar28->img_y;
              if (comp != (int *)0x0) {
                *comp = (uint)(2 < psVar28->img_n) * 2 + 1;
              }
              goto LAB_0010389e;
            }
            iVar11 = stbi__process_marker(psVar16,(uint)bVar8);
            if (iVar11 != 0) goto LAB_00102500;
          }
          goto LAB_0010388f;
        }
        iVar11 = stbi__get16be(psVar16->s);
        bVar8 = stbi__get8(psVar16->s);
        uVar43 = (uint)bVar8;
        psVar16->scan_n = (uint)bVar8;
        if (((byte)(bVar8 - 5) < 0xfc) || (psVar28 = psVar16->s, psVar28->img_n < (int)(uint)bVar8))
        {
          stbi__g_failure_reason = "bad SOS component count";
        }
        else if (iVar11 == (uint)bVar8 * 2 + 6) {
          lVar17 = 0;
          while( true ) {
            bVar8 = stbi__get8(psVar28);
            if ((int)uVar43 <= lVar17) break;
            bVar9 = stbi__get8(psVar16->s);
            psVar28 = psVar16->s;
            uVar43 = psVar28->img_n;
            uVar22 = 0;
            if (0 < (int)uVar43) {
              uVar22 = (ulong)uVar43;
            }
            paVar34 = paVar1;
            for (uVar41 = 0; uVar22 != uVar41; uVar41 = uVar41 + 1) {
              if (paVar34->id == (uint)bVar8) {
                uVar22 = uVar41 & 0xffffffff;
                break;
              }
              paVar34 = paVar34 + 1;
            }
            if ((uint)uVar22 == uVar43) goto LAB_0010388f;
            psVar16->img_comp[uVar22].hd = (uint)(bVar9 >> 4);
            if (0x3f < bVar9) {
              stbi__g_failure_reason = "bad DC huff";
              goto LAB_0010388f;
            }
            paVar1[uVar22].ha = bVar9 & 0xf;
            if (3 < (bVar9 & 0xf)) {
              stbi__g_failure_reason = "bad AC huff";
              goto LAB_0010388f;
            }
            psVar16->order[lVar17] = (uint)uVar22;
            lVar17 = lVar17 + 1;
            uVar43 = psVar16->scan_n;
          }
          psVar16->spec_start = (uint)bVar8;
          bVar8 = stbi__get8(psVar16->s);
          psVar16->spec_end = (uint)bVar8;
          bVar8 = stbi__get8(psVar16->s);
          psVar16->succ_high = (uint)(bVar8 >> 4);
          psVar16->succ_low = bVar8 & 0xf;
          iVar11 = psVar16->spec_start;
          if (psVar16->progressive == 0) {
            if (((iVar11 == 0) && (bVar8 < 0x10)) && ((bVar8 & 0xf) == 0)) {
              psVar16->spec_end = 0x3f;
              goto LAB_0010269e;
            }
          }
          else if (((iVar11 < 0x40) && (psVar16->spec_end < 0x40)) &&
                  ((iVar11 <= psVar16->spec_end && ((bVar8 < 0xe0 && ((bVar8 & 0xf) < 0xe)))))) {
LAB_0010269e:
            stbi__jpeg_reset(psVar16);
            if (psVar16->progressive == 0) {
              if (psVar16->scan_n == 1) {
                iVar11 = psVar16->order[0];
                uVar43 = psVar16->img_comp[iVar11].x + 7 >> 3;
                iVar15 = psVar16->img_comp[iVar11].y + 7 >> 3;
                if ((int)uVar43 < 1) {
                  uVar43 = 0;
                }
                iVar38 = 0;
                if (iVar15 < 1) {
                  iVar15 = 0;
                }
                for (iVar31 = 0; iVar31 != iVar15; iVar31 = iVar31 + 1) {
                  for (lVar17 = 0; (ulong)uVar43 * 8 != lVar17; lVar17 = lVar17 + 8) {
                    iVar32 = stbi__jpeg_decode_block
                                       (psVar16,data,psVar16->huff_dc + paVar1[iVar11].hd,
                                        psVar16->huff_ac + paVar1[iVar11].ha,
                                        psVar16->fast_ac[paVar1[iVar11].ha],iVar11,
                                        psVar16->dequant[paVar1[iVar11].tq]);
                    if (iVar32 == 0) {
                      bVar46 = false;
                      goto LAB_00102f33;
                    }
                    (*psVar16->idct_block_kernel)
                              (paVar1[iVar11].data + lVar17 + iVar38 * paVar1[iVar11].w2,
                               paVar1[iVar11].w2,data);
                    iVar32 = psVar16->todo;
                    psVar16->todo = iVar32 + -1;
                    if (iVar32 < 2) {
                      if (psVar16->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar16);
                      }
                      if ((psVar16->marker & 0xf8) != 0xd0) goto LAB_00102f30;
                      stbi__jpeg_reset(psVar16);
                    }
                  }
                  iVar38 = iVar38 + 8;
                }
              }
              else {
                for (iVar11 = 0; iVar11 < psVar16->img_mcu_y; iVar11 = iVar11 + 1) {
                  for (iVar15 = 0; iVar15 < psVar16->img_mcu_x; iVar15 = iVar15 + 1) {
                    for (lVar17 = 0; lVar17 < psVar16->scan_n; lVar17 = lVar17 + 1) {
                      iVar38 = psVar16->order[lVar17];
                      for (iVar31 = 0; iVar31 < paVar1[iVar38].v; iVar31 = iVar31 + 1) {
                        for (iVar32 = 0; iVar13 = paVar1[iVar38].h, iVar32 < iVar13;
                            iVar32 = iVar32 + 1) {
                          iVar42 = paVar1[iVar38].v;
                          iVar14 = stbi__jpeg_decode_block
                                             (psVar16,data,psVar16->huff_dc + paVar1[iVar38].hd,
                                              psVar16->huff_ac + paVar1[iVar38].ha,
                                              psVar16->fast_ac[paVar1[iVar38].ha],iVar38,
                                              psVar16->dequant[paVar1[iVar38].tq]);
                          if (iVar14 == 0) {
                            bVar46 = false;
                            goto LAB_00102f33;
                          }
                          (*psVar16->idct_block_kernel)
                                    (paVar1[iVar38].data +
                                     (long)((iVar13 * iVar15 + iVar32) * 8) +
                                     (long)((iVar42 * iVar11 + iVar31) * paVar1[iVar38].w2 * 8),
                                     paVar1[iVar38].w2,data);
                        }
                      }
                    }
                    iVar38 = psVar16->todo;
                    psVar16->todo = iVar38 + -1;
                    if (iVar38 < 2) {
                      if (psVar16->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar16);
                      }
                      if ((psVar16->marker & 0xf8) != 0xd0) goto LAB_00102f30;
                      stbi__jpeg_reset(psVar16);
                    }
                  }
                }
              }
LAB_00102f30:
              bVar46 = true;
LAB_00102f33:
              if (!bVar46) goto LAB_0010388f;
            }
            else if (psVar16->scan_n == 1) {
              iVar11 = psVar16->order[0];
              iVar15 = psVar16->img_comp[iVar11].x + 7 >> 3;
              iVar38 = psVar16->img_comp[iVar11].y + 7 >> 3;
              iVar31 = 0;
              if (iVar15 < 1) {
                iVar15 = iVar31;
              }
              if (iVar38 < 1) {
                iVar38 = iVar31;
              }
              for (; iVar31 != iVar38; iVar31 = iVar31 + 1) {
                for (iVar32 = 0; iVar32 != iVar15; iVar32 = iVar32 + 1) {
                  psVar44 = paVar1[iVar11].coeff + (paVar1[iVar11].coeff_w * iVar31 + iVar32) * 0x40
                  ;
                  uVar22 = (ulong)psVar16->spec_start;
                  if (uVar22 == 0) {
                    iVar13 = stbi__jpeg_decode_block_prog_dc
                                       (psVar16,psVar44,psVar16->huff_dc + paVar1[iVar11].hd,iVar11)
                    ;
                    if (iVar13 == 0) goto LAB_0010388f;
                  }
                  else {
                    iVar13 = paVar1[iVar11].ha;
                    iVar42 = psVar16->eob_run;
                    bVar8 = (byte)psVar16->succ_low;
                    if (psVar16->succ_high == 0) {
                      if (iVar42 == 0) {
                        do {
                          if (psVar16->code_bits < 0x10) {
                            stbi__grow_buffer_unsafe(psVar16);
                          }
                          sVar24 = psVar16->fast_ac[iVar13][psVar16->code_buffer >> 0x17];
                          uVar43 = (uint)sVar24;
                          iVar42 = (int)uVar22;
                          if (sVar24 == 0) {
                            uVar43 = stbi__jpeg_huff_decode(psVar16,psVar16->huff_ac + iVar13);
                            if ((int)uVar43 < 0) goto LAB_0010374a;
                            uVar27 = uVar43 >> 4;
                            if ((uVar43 & 0xf) == 0) {
                              if (uVar43 < 0xf0) {
                                iVar42 = 1 << ((byte)uVar27 & 0x1f);
                                psVar16->eob_run = iVar42;
                                if (0xf < uVar43) {
                                  iVar42 = stbi__jpeg_get_bits(psVar16,uVar27);
                                  iVar42 = iVar42 + psVar16->eob_run;
                                }
                                goto LAB_0010284b;
                              }
                              uVar22 = (ulong)(iVar42 + 0x10);
                            }
                            else {
                              lVar17 = (ulong)uVar27 + (long)iVar42;
                              uVar22 = (ulong)((int)lVar17 + 1);
                              bVar9 = ""[lVar17];
                              iVar42 = stbi__extend_receive(psVar16,uVar43 & 0xf);
                              psVar44[bVar9] = (short)(iVar42 << (bVar8 & 0x1f));
                            }
                          }
                          else {
                            lVar17 = (ulong)(uVar43 >> 4 & 0xf) + (long)iVar42;
                            psVar16->code_buffer = psVar16->code_buffer << (sbyte)(uVar43 & 0xf);
                            psVar16->code_bits = psVar16->code_bits - (uVar43 & 0xf);
                            uVar22 = (ulong)((int)lVar17 + 1);
                            psVar44[""[lVar17]] = (short)((uVar43 >> 8) << (bVar8 & 0x1f));
                          }
                        } while ((int)uVar22 <= psVar16->spec_end);
                      }
                      else {
LAB_0010284b:
                        psVar16->eob_run = iVar42 + -1;
                      }
                    }
                    else if (iVar42 == 0) {
                      iVar42 = 0x10000 << (bVar8 & 0x1f);
                      do {
                        uVar43 = stbi__jpeg_huff_decode(psVar16,psVar16->huff_ac + iVar13);
                        if ((int)uVar43 < 0) goto LAB_0010374a;
                        uVar27 = uVar43 >> 4;
                        if ((uVar43 & 0xf) == 1) {
                          iVar14 = stbi__jpeg_get_bit(psVar16);
                          iVar25 = 1;
                          if (iVar14 == 0) {
                            iVar25 = 0xffff;
                          }
                          sVar24 = (short)(iVar25 << (bVar8 & 0x1f));
                        }
                        else {
                          if ((uVar43 & 0xf) != 0) {
                            stbi__g_failure_reason = "bad huffman code";
                            goto LAB_0010388f;
                          }
                          if (uVar43 < 0xf0) {
                            psVar16->eob_run = ~(-1 << ((byte)uVar27 & 0x1f));
                            if (0xf < uVar43) {
                              iVar14 = stbi__jpeg_get_bits(psVar16,uVar27);
                              psVar16->eob_run = psVar16->eob_run + iVar14;
                            }
                            uVar27 = 0x40;
                          }
                          else {
                            uVar27 = 0xf;
                          }
                          sVar24 = 0;
                        }
                        uVar41 = (long)(int)uVar22;
                        do {
                          while( true ) {
                            uVar22 = uVar41;
                            iVar14 = psVar16->spec_end;
                            if ((long)iVar14 < (long)uVar22) goto LAB_0010297a;
                            bVar9 = ""[uVar22];
                            if (psVar44[bVar9] == 0) break;
                            iVar14 = stbi__jpeg_get_bit(psVar16);
                            if ((iVar14 != 0) &&
                               (sVar4 = psVar44[bVar9], (iVar42 >> 0x10 & (int)sVar4) == 0)) {
                              sVar7 = (short)((uint)iVar42 >> 0x10);
                              if (sVar4 < 1) {
                                sVar7 = -sVar7;
                              }
                              psVar44[bVar9] = sVar4 + sVar7;
                            }
                            uVar41 = uVar22 + 1;
                          }
                          bVar46 = uVar27 != 0;
                          uVar27 = uVar27 - 1;
                          uVar41 = uVar22 + 1;
                        } while (bVar46);
                        psVar44[bVar9] = sVar24;
                        uVar22 = uVar22 + 1;
LAB_0010297a:
                      } while ((int)uVar22 <= iVar14);
                    }
                    else {
                      psVar16->eob_run = iVar42 + -1;
                      uVar43 = (0x10000 << (bVar8 & 0x1f)) >> 0x10;
                      for (; (long)uVar22 <= (long)psVar16->spec_end; uVar22 = uVar22 + 1) {
                        bVar8 = ""[uVar22];
                        if (((psVar44[bVar8] != 0) &&
                            (iVar13 = stbi__jpeg_get_bit(psVar16), iVar13 != 0)) &&
                           (sVar24 = psVar44[bVar8], (uVar43 & (int)sVar24) == 0)) {
                          uVar27 = -uVar43;
                          if (0 < sVar24) {
                            uVar27 = uVar43;
                          }
                          psVar44[bVar8] = (short)uVar27 + sVar24;
                        }
                      }
                    }
                  }
                  iVar13 = psVar16->todo;
                  psVar16->todo = iVar13 + -1;
                  if (iVar13 < 2) {
                    if (psVar16->code_bits < 0x18) {
                      stbi__grow_buffer_unsafe(psVar16);
                    }
                    bVar8 = psVar16->marker;
                    if ((bVar8 & 0xf8) != 0xd0) goto LAB_00102f42;
                    stbi__jpeg_reset(psVar16);
                  }
                }
              }
            }
            else {
              for (iVar11 = 0; iVar11 < psVar16->img_mcu_y; iVar11 = iVar11 + 1) {
                for (iVar15 = 0; iVar15 < psVar16->img_mcu_x; iVar15 = iVar15 + 1) {
                  for (lVar17 = 0; lVar17 < psVar16->scan_n; lVar17 = lVar17 + 1) {
                    iVar38 = psVar16->order[lVar17];
                    for (iVar31 = 0; iVar31 < paVar1[iVar38].v; iVar31 = iVar31 + 1) {
                      iVar32 = 0;
                      while (iVar32 < paVar1[iVar38].h) {
                        iVar13 = stbi__jpeg_decode_block_prog_dc
                                           (psVar16,paVar1[iVar38].coeff +
                                                    (paVar1[iVar38].h * iVar15 + iVar32 +
                                                    (paVar1[iVar38].v * iVar11 + iVar31) *
                                                    paVar1[iVar38].coeff_w) * 0x40,
                                            psVar16->huff_dc + paVar1[iVar38].hd,iVar38);
                        iVar32 = iVar32 + 1;
                        if (iVar13 == 0) goto LAB_0010388f;
                      }
                    }
                  }
                  iVar38 = psVar16->todo;
                  psVar16->todo = iVar38 + -1;
                  if (iVar38 < 2) {
                    if (psVar16->code_bits < 0x18) {
                      stbi__grow_buffer_unsafe(psVar16);
                    }
                    bVar8 = psVar16->marker;
                    if ((bVar8 & 0xf8) != 0xd0) goto LAB_00102f42;
                    stbi__jpeg_reset(psVar16);
                  }
                }
              }
            }
            bVar8 = psVar16->marker;
LAB_00102f42:
            if (bVar8 == 0xff) {
              do {
                iVar11 = stbi__at_eof(psVar16->s);
                if (iVar11 != 0) goto LAB_00102500;
                sVar10 = stbi__get8(psVar16->s);
              } while (sVar10 != 0xff);
              sVar10 = stbi__get8(psVar16->s);
              psVar16->marker = sVar10;
            }
            goto LAB_00102500;
          }
          stbi__g_failure_reason = "bad SOS";
        }
        else {
          stbi__g_failure_reason = "bad SOS len";
        }
      }
LAB_0010388f:
      stbi__cleanup_jpeg(psVar16);
    }
    else {
      stbi__g_failure_reason = "bad req_comp";
    }
LAB_0010389c:
    pvVar18 = (void *)0x0;
LAB_0010389e:
    free(psVar16);
  }
  return pvVar18;
LAB_0010374a:
  stbi__g_failure_reason = "bad huffman code";
  goto LAB_0010388f;
LAB_00102500:
  bVar8 = stbi__get_marker(psVar16);
  goto LAB_0010249d;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int /*bpc*/)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}